

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O3

string * __thiscall
cmOutputConverter::Shell__GetArgument_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,char *in,int flags)

{
  string *psVar1;
  int iVar2;
  cmOutputConverter *pcVar3;
  ulong uVar4;
  byte bVar5;
  char *pcVar6;
  int iVar7;
  ostringstream out;
  byte local_1d1;
  uint local_1d0;
  byte local_1c9;
  int local_1c8;
  uint local_1c4;
  string *local_1c0;
  char *local_1b8;
  ulong local_1b0;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_1d0 = (uint)in;
  iVar2 = Shell__ArgumentNeedsQuotes((char *)this,local_1d0);
  if (iVar2 != 0) {
    if ((char)local_1d0 < '\0') {
      if ((local_1d0 >> 8 & 1) != 0) {
        local_1d1 = 0x22;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)&local_1d1,1);
      }
      local_1d1 = 0x27;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1d1,1);
    }
    else {
      local_1d1 = 0x22;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1d1,1);
    }
  }
  bVar5 = *(byte *)&(this->StateSnapshot).State;
  local_1c8 = iVar2;
  local_1c0 = __return_storage_ptr__;
  if (bVar5 == 0) {
    iVar2 = 0;
  }
  else {
    local_1c4 = local_1d0 & 9;
    local_1c9 = (local_1d0 & 0x30) != 0 & (byte)local_1d0 | (byte)((local_1d0 & 2) >> 1);
    local_1b8 = "$$";
    if ((local_1d0 & 1) == 0) {
      local_1b8 = "\"$\"";
    }
    local_1b0 = (ulong)(local_1d0 & 1) ^ 3;
    iVar7 = 0;
    do {
      if (((local_1d0 & 0x40) != 0) &&
         (pcVar3 = (cmOutputConverter *)Shell__SkipMakeVariables((char *)this), pcVar3 != this)) {
        do {
          local_1d1 = *(byte *)&(this->StateSnapshot).State;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)&local_1d1,1);
          this = (cmOutputConverter *)((long)&(this->StateSnapshot).State + 1);
        } while (this != pcVar3);
        bVar5 = *(byte *)&(this->StateSnapshot).State;
        iVar7 = 0;
        iVar2 = 0;
        if (bVar5 == 0) break;
      }
      if ((local_1d0 >> 8 & 1) == 0) {
        if ((local_1d0 & 4) != 0) {
LAB_002cf205:
          bVar5 = *(byte *)&(this->StateSnapshot).State;
          iVar2 = iVar7;
          goto LAB_002cf20b;
        }
        if (bVar5 != 0x5c) {
          iVar2 = 0;
          if (bVar5 != 0x22) goto LAB_002cf20b;
          if (0 < iVar7) {
            iVar7 = iVar7 + 1;
            do {
              local_1d1 = 0x5c;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)&local_1d1,1);
              iVar7 = iVar7 + -1;
            } while (1 < iVar7);
            iVar7 = 0;
          }
          local_1d1 = 0x5c;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)&local_1d1,1);
          goto LAB_002cf205;
        }
        iVar7 = iVar7 + 1;
        bVar5 = 0x5c;
LAB_002cf2f0:
        local_1d1 = bVar5;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)&local_1d1,1);
      }
      else {
        iVar2 = iVar7;
        if ((bVar5 - 0x22 < 0x3f) &&
           ((0x4400000000000005U >> ((ulong)(bVar5 - 0x22) & 0x3f) & 1) != 0)) {
          local_1d1 = 0x5c;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)&local_1d1,1);
          goto LAB_002cf205;
        }
LAB_002cf20b:
        iVar7 = iVar2;
        if (bVar5 < 0x25) {
          if (bVar5 == 0x23) {
            uVar4 = 2;
            pcVar6 = "$#";
            if (local_1c4 == 9) {
LAB_002cf2c6:
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,uVar4);
            }
            else {
              local_1d1 = 0x23;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)&local_1d1,1);
            }
          }
          else {
            if (bVar5 != 0x24) goto LAB_002cf2f0;
            uVar4 = local_1b0;
            pcVar6 = local_1b8;
            if ((local_1d0 & 3) != 0) goto LAB_002cf2c6;
            local_1d1 = 0x24;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(char *)&local_1d1,1);
          }
        }
        else if (bVar5 == 0x25) {
          uVar4 = 2;
          pcVar6 = "%%";
          if (local_1c9 != 0) goto LAB_002cf2c6;
          local_1d1 = 0x25;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)&local_1d1,1);
        }
        else {
          if (bVar5 != 0x3b) goto LAB_002cf2f0;
          uVar4 = 3;
          pcVar6 = "\";\"";
          if ((local_1d0 & 2) != 0) goto LAB_002cf2c6;
          local_1d1 = 0x3b;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)&local_1d1,1);
        }
      }
      bVar5 = *(byte *)((long)&(this->StateSnapshot).State + 1);
      this = (cmOutputConverter *)((long)&(this->StateSnapshot).State + 1);
      iVar2 = iVar7;
    } while (bVar5 != 0);
  }
  psVar1 = local_1c0;
  if (local_1c8 != 0) {
    if (0 < iVar2) {
      iVar2 = iVar2 + 1;
      do {
        local_1d1 = 0x5c;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)&local_1d1,1);
        iVar2 = iVar2 + -1;
      } while (1 < iVar2);
    }
    if ((char)local_1d0 < '\0') {
      local_1d1 = 0x27;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1d1,1);
      if ((local_1d0 >> 8 & 1) != 0) {
        local_1d1 = 0x22;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)&local_1d1,1);
      }
    }
    else {
      local_1d1 = 0x22;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1d1,1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar1;
}

Assistant:

std::string cmOutputConverter::Shell__GetArgument(const char* in, int flags)
{
  std::ostringstream out;

  /* String iterator.  */
  const char* c;

  /* Keep track of how many backslashes have been encountered in a row.  */
  int windows_backslashes = 0;

  /* Whether the argument must be quoted.  */
  int needQuotes = Shell__ArgumentNeedsQuotes(in, flags);
  if (needQuotes) {
    /* Add the opening quote for this argument.  */
    if (flags & Shell_Flag_WatcomQuote) {
      if (flags & Shell_Flag_IsUnix) {
        out << '"';
      }
      out << '\'';
    } else {
      out << '"';
    }
  }

  /* Scan the string for characters that require escaping or quoting.  */
  for (c = in; *c; ++c) {
    /* Look for $(MAKEVAR) syntax if requested.  */
    if (flags & Shell_Flag_AllowMakeVariables) {
      const char* skip = Shell__SkipMakeVariables(c);
      if (skip != c) {
        /* Copy to the end of the make variable references.  */
        while (c != skip) {
          out << *c++;
        }

        /* The make variable reference eliminates any escaping needed
           for preceding backslashes.  */
        windows_backslashes = 0;

        /* Stop if we have reached the end of the string.  */
        if (!*c) {
          break;
        }
      }
    }

    /* Check whether this character needs escaping for the shell.  */
    if (flags & Shell_Flag_IsUnix) {
      /* On Unix a few special characters need escaping even inside a
         quoted argument.  */
      if (*c == '\\' || *c == '"' || *c == '`' || *c == '$') {
        /* This character needs a backslash to escape it.  */
        out << '\\';
      }
    } else if (flags & Shell_Flag_EchoWindows) {
      /* On Windows the built-in command shell echo never needs escaping.  */
    } else {
      /* On Windows only backslashes and double-quotes need escaping.  */
      if (*c == '\\') {
        /* Found a backslash.  It may need to be escaped later.  */
        ++windows_backslashes;
      } else if (*c == '"') {
        /* Found a double-quote.  Escape all immediately preceding
           backslashes.  */
        while (windows_backslashes > 0) {
          --windows_backslashes;
          out << '\\';
        }

        /* Add the backslash to escape the double-quote.  */
        out << '\\';
      } else {
        /* We encountered a normal character.  This eliminates any
           escaping needed for preceding backslashes.  */
        windows_backslashes = 0;
      }
    }

    /* Check whether this character needs escaping for a make tool.  */
    if (*c == '$') {
      if (flags & Shell_Flag_Make) {
        /* In Makefiles a dollar is written $$.  The make tool will
           replace it with just $ before passing it to the shell.  */
        out << "$$";
      } else if (flags & Shell_Flag_VSIDE) {
        /* In a VS IDE a dollar is written "$".  If this is written in
           an un-quoted argument it starts a quoted segment, inserts
           the $ and ends the segment.  If it is written in a quoted
           argument it ends quoting, inserts the $ and restarts
           quoting.  Either way the $ is isolated from surrounding
           text to avoid looking like a variable reference.  */
        out << "\"$\"";
      } else {
        /* Otherwise a dollar is written just $. */
        out << '$';
      }
    } else if (*c == '#') {
      if ((flags & Shell_Flag_Make) && (flags & Shell_Flag_WatcomWMake)) {
        /* In Watcom WMake makefiles a pound is written $#.  The make
           tool will replace it with just # before passing it to the
           shell.  */
        out << "$#";
      } else {
        /* Otherwise a pound is written just #. */
        out << '#';
      }
    } else if (*c == '%') {
      if ((flags & Shell_Flag_VSIDE) ||
          ((flags & Shell_Flag_Make) &&
           ((flags & Shell_Flag_MinGWMake) || (flags & Shell_Flag_NMake)))) {
        /* In the VS IDE, NMake, or MinGW make a percent is written %%.  */
        out << "%%";
      } else {
        /* Otherwise a percent is written just %. */
        out << '%';
      }
    } else if (*c == ';') {
      if (flags & Shell_Flag_VSIDE) {
        /* In a VS IDE a semicolon is written ";".  If this is written
           in an un-quoted argument it starts a quoted segment,
           inserts the ; and ends the segment.  If it is written in a
           quoted argument it ends quoting, inserts the ; and restarts
           quoting.  Either way the ; is isolated.  */
        out << "\";\"";
      } else {
        /* Otherwise a semicolon is written just ;. */
        out << ';';
      }
    } else {
      /* Store this character.  */
      out << *c;
    }
  }

  if (needQuotes) {
    /* Add enough backslashes to escape any trailing ones.  */
    while (windows_backslashes > 0) {
      --windows_backslashes;
      out << '\\';
    }

    /* Add the closing quote for this argument.  */
    if (flags & Shell_Flag_WatcomQuote) {
      out << '\'';
      if (flags & Shell_Flag_IsUnix) {
        out << '"';
      }
    } else {
      out << '"';
    }
  }

  return out.str();
}